

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::SetRequiredCMakeVersion
          (cmExportFileGenerator *this,uint major,uint minor,uint patch)

{
  if ((ulong)this->RequiredCMakeVersionPatch % 100000000 +
      ((ulong)this->RequiredCMakeVersionMinor % 1000 +
      (ulong)(this->RequiredCMakeVersionMajor * 1000)) * 100000000 <
      (ulong)patch % 100000000 + ((ulong)minor % 1000 + (ulong)(major * 1000)) * 100000000) {
    this->RequiredCMakeVersionMajor = major;
    this->RequiredCMakeVersionMinor = minor;
    this->RequiredCMakeVersionPatch = patch;
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetRequiredCMakeVersion(unsigned int major,
                                                    unsigned int minor,
                                                    unsigned int patch)
{
  if (CMake_VERSION_ENCODE(major, minor, patch) >
      CMake_VERSION_ENCODE(this->RequiredCMakeVersionMajor,
                           this->RequiredCMakeVersionMinor,
                           this->RequiredCMakeVersionPatch)) {
    this->RequiredCMakeVersionMajor = major;
    this->RequiredCMakeVersionMinor = minor;
    this->RequiredCMakeVersionPatch = patch;
  }
}